

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipState.hpp
# Opt level: O3

void __thiscall
linq::SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::Init
          (SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>
           *this)

{
  pointer piVar1;
  size_t sVar2;
  pointer piVar3;
  size_t sVar4;
  bool bVar5;
  
  this->current = 0;
  piVar3 = (this->source).source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->source).source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->source).current._M_current = piVar3;
  (this->source).end._M_current = piVar1;
  sVar2 = this->count;
  if (sVar2 != 0) {
    sVar4 = 1;
    do {
      if (piVar3 == piVar1) {
        return;
      }
      piVar3 = piVar3 + 1;
      (this->source).current._M_current = piVar3;
      this->current = sVar4;
      bVar5 = sVar4 != sVar2;
      sVar4 = sVar4 + 1;
    } while (bVar5);
  }
  return;
}

Assistant:

void Init() override final
			{
				current = 0;
				source.Init(); 
				
				while(current < count && source.Valid()) {
					source.Advance();
					current++;
				}
			}